

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O1

void integer_suite::test_literal_zero_one(void)

{
  writer writer;
  ostringstream result;
  undefined4 local_1e0;
  int local_1dc;
  long *local_1d8 [2];
  long local_1c8 [2];
  type local_1b8;
  void *local_1a0;
  long local_190;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::ostringstream>
            ((basic_writer<char,16ul> *)&local_1b8.__align,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1dc = 0;
  local_1d8[0] = (long *)trial::protocol::json::basic_writer<char,_16UL>::value<int>
                                   ((basic_writer<char,_16UL> *)&local_1b8.__align,&local_1dc);
  local_1e0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(0)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7c,"void integer_suite::test_literal_zero_one()",local_1d8,&local_1e0);
  local_1dc = 1;
  local_1d8[0] = (long *)trial::protocol::json::basic_writer<char,_16UL>::value<int>
                                   ((basic_writer<char,_16UL> *)&local_1b8.__align,&local_1dc);
  local_1e0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(1)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7d,"void integer_suite::test_literal_zero_one()",local_1d8,&local_1e0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"0,1\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7e,"void integer_suite::test_literal_zero_one()",local_1d8,"0,1");
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (local_1a0 != (void *)0x0) {
    operator_delete(local_1a0,local_190 - (long)local_1a0);
  }
  (**(code **)local_1b8._0_8_)();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_literal_zero_one()
{
    std::ostringstream result;
    json::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(0), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(1), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "0,1");
}